

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::JsonUnitTestResultPrinter::EscapeJson
                   (string *__return_storage_ptr__,string *str)

{
  ulong uVar1;
  ulong uVar2;
  byte *pbVar3;
  Message *this;
  uchar value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  Message *in_stack_ffffffffffffff70;
  string local_60;
  char local_2a;
  byte local_29;
  ulong uStack_28;
  char ch;
  size_t i;
  Message m;
  string *str_local;
  
  m.ss_.ptr_ = (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )str;
  Message::Message((Message *)&i);
  for (uStack_28 = 0; uVar1 = uStack_28, uVar2 = std::__cxx11::string::size(), uVar1 < uVar2;
      uStack_28 = uStack_28 + 1) {
    pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)m.ss_.ptr_);
    local_29 = *pbVar3;
    if (local_29 == 8) {
      Message::operator<<(in_stack_ffffffffffffff70,(char (*) [3])in_stack_ffffffffffffff68);
    }
    else if (local_29 == 9) {
      Message::operator<<(in_stack_ffffffffffffff70,(char (*) [3])in_stack_ffffffffffffff68);
    }
    else if (local_29 == 10) {
      Message::operator<<(in_stack_ffffffffffffff70,(char (*) [3])in_stack_ffffffffffffff68);
    }
    else if (local_29 == 0xc) {
      Message::operator<<(in_stack_ffffffffffffff70,(char (*) [3])in_stack_ffffffffffffff68);
    }
    else if (local_29 == 0xd) {
      Message::operator<<(in_stack_ffffffffffffff70,(char (*) [3])in_stack_ffffffffffffff68);
    }
    else if (((local_29 == 0x22) || (local_29 == 0x2f)) || (local_29 == 0x5c)) {
      local_2a = '\\';
      this = Message::operator<<((Message *)&i,&local_2a);
      Message::operator<<(this,(char *)&local_29);
    }
    else if ((char)local_29 < ' ') {
      in_stack_ffffffffffffff70 =
           Message::operator<<(in_stack_ffffffffffffff70,(char (*) [5])in_stack_ffffffffffffff68);
      String::FormatByte_abi_cxx11_(&local_60,(String *)(ulong)local_29,value);
      Message::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      Message::operator<<((Message *)&i,(char *)&local_29);
    }
  }
  Message::GetString_abi_cxx11_(__return_storage_ptr__,(Message *)&i);
  Message::~Message((Message *)0x77858d);
  return __return_storage_ptr__;
}

Assistant:

std::string JsonUnitTestResultPrinter::EscapeJson(const std::string& str) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '\\':
      case '"':
      case '/':
        m << '\\' << ch;
        break;
      case '\b':
        m << "\\b";
        break;
      case '\t':
        m << "\\t";
        break;
      case '\n':
        m << "\\n";
        break;
      case '\f':
        m << "\\f";
        break;
      case '\r':
        m << "\\r";
        break;
      default:
        if (ch < ' ') {
          m << "\\u00" << String::FormatByte(static_cast<unsigned char>(ch));
        } else {
          m << ch;
        }
        break;
    }
  }

  return m.GetString();
}